

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::FboStateQueryTests::init(FboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ApiCase *pAVar1;
  
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"framebuffer_attachment_object",
                   "FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_021259a8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_level","FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02125a00;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_cube_map_face",
                   "FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_02125a58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  return extraout_EAX;
}

Assistant:

void FboStateQueryTests::init (void)
{
	addChild(new AttachmentObjectCase				(m_context, "framebuffer_attachment_object",				"FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME"));
	addChild(new AttachmentTextureLevelCase			(m_context, "framebuffer_attachment_texture_level",			"FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL"));
	addChild(new AttachmentTextureCubeMapFaceCase	(m_context, "framebuffer_attachment_texture_cube_map_face",	"FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE"));
}